

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O3

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitExpr
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,CallExpression *expr)

{
  __index_type _Var1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_00;
  long *plVar4;
  char cVar5;
  long lVar6;
  long lVar7;
  
  ast::CallExpression::visitExprsNoArgs<slang::analysis::DataFlowAnalysis&>
            (expr,(DataFlowAnalysis *)this);
  _Var1 = *(__index_type *)
           ((long)&(expr->subroutine).
                   super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                   .
                   super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
           + 0x30);
  sVar2 = (expr->arguments_)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    ppEVar3 = (expr->arguments_)._M_ptr;
    lVar6 = sVar2 << 3;
    lVar7 = 0;
    do {
      this_00 = ppEVar3[lVar7];
      if (_Var1 == '\x01') {
        plVar4 = *(long **)&(expr->subroutine).
                            super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            ._M_u;
        cVar5 = (**(code **)(*plVar4 + 0x20))(plVar4,lVar7);
        if (cVar5 == '\0') goto LAB_0061aeb5;
      }
      else {
LAB_0061aeb5:
        ast::Expression::
        visitExpression<slang::ast::Expression_const,slang::analysis::DataFlowAnalysis&>
                  (this_00,this_00,(DataFlowAnalysis *)this);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + -8;
    } while (lVar6 != 0);
  }
  if ((_Var1 == '\x01') &&
     (*(char *)(*(long *)&(expr->subroutine).
                          super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          .
                          super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          ._M_u + 0x31) == '\x01')) {
    setUnreachable(this);
    return;
  }
  return;
}

Assistant:

void visitExpr(const CallExpression& expr) {
        expr.visitExprsNoArgs(DERIVED);

        auto sysCall = std::get_if<CallExpression::SystemCallInfo>(&expr.subroutine);
        size_t argIndex = 0;
        for (auto arg : expr.arguments()) {
            if (!sysCall || !sysCall->subroutine->isArgUnevaluated(argIndex))
                visit(*arg);
            argIndex++;
        }

        if (sysCall && sysCall->subroutine->neverReturns)
            setUnreachable();
    }